

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

bool __thiscall CBanDB::Read(CBanDB *this,banmap_t *banSet)

{
  _Base_ptr *pp_Var1;
  long lVar2;
  pointer pcVar3;
  pointer pbVar4;
  char cVar5;
  bool bVar6;
  mapped_type *bans_json;
  pointer args_1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  undefined1 local_88 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  settings;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = std::filesystem::status((path *)this);
  if ((cVar5 != '\0') && (cVar5 != -1)) {
    pcVar3 = (this->m_banlist_dat).super_path._M_pathname._M_dataplus._M_p;
    pp_Var1 = &settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    settings._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&settings,pcVar3,
               pcVar3 + (this->m_banlist_dat).super_path._M_pathname._M_string_length);
    local_88[8] = '\"';
    local_88[9] = '&';
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "Read";
    logging_function._M_len = 4;
    local_88._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&settings;
    LogPrintFormatInternal<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (logging_function,source_file,0x99,ALL,Info,(ConstevalFormatString<1U>)0xf8e752,
               (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)local_88);
    if ((_Base_ptr *)settings._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)settings._M_t._M_impl._0_8_,
                      (ulong)((long)&(settings._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cVar5 = std::filesystem::status(&(this->m_banlist_json).super_path);
  bVar6 = false;
  if ((cVar5 != '\0') && (bVar6 = false, cVar5 != -1)) {
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &settings._M_t._M_impl.super__Rb_tree_header._M_header;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar6 = common::ReadSettings(&this->m_banlist_json,&settings,&errors);
    pbVar4 = errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar6) {
      local_88._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"banned_nets","");
      bans_json = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                  ::operator[](&settings,(key_type *)local_88);
      BanMapFromJson(bans_json,banSet);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      bVar6 = true;
    }
    else {
      if (errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        args_1 = errors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar3 = (this->m_banlist_json).super_path._M_pathname._M_dataplus._M_p;
          local_88._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_88 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,pcVar3,
                     pcVar3 + (this->m_banlist_json).super_path._M_pathname._M_string_length);
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
          ;
          source_file_00._M_len = 0x5a;
          logging_function_00._M_str = "Read";
          logging_function_00._M_len = 4;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_00,source_file_00,0xa5,ALL,Info,
                     (ConstevalFormatString<2U>)0xf8e7c4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     args_1);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10)
             ) {
            operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
          }
          args_1 = args_1 + 1;
        } while (args_1 != pbVar4);
      }
      bVar6 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&errors);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~_Rb_tree(&settings._M_t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CBanDB::Read(banmap_t& banSet)
{
    if (fs::exists(m_banlist_dat)) {
        LogPrintf("banlist.dat ignored because it can only be read by " PACKAGE_NAME " version 22.x. Remove %s to silence this warning.\n", fs::quoted(fs::PathToString(m_banlist_dat)));
    }
    // If the JSON banlist does not exist, then recreate it
    if (!fs::exists(m_banlist_json)) {
        return false;
    }

    std::map<std::string, common::SettingsValue> settings;
    std::vector<std::string> errors;

    if (!common::ReadSettings(m_banlist_json, settings, errors)) {
        for (const auto& err : errors) {
            LogPrintf("Cannot load banlist %s: %s\n", fs::PathToString(m_banlist_json), err);
        }
        return false;
    }

    try {
        BanMapFromJson(settings[JSON_KEY], banSet);
    } catch (const std::runtime_error& e) {
        LogPrintf("Cannot parse banlist %s: %s\n", fs::PathToString(m_banlist_json), e.what());
        return false;
    }

    return true;
}